

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNCommaBase::fold_binop(CTPNCommaBase *this)

{
  CTcPrsNode *pCVar1;
  CTcPrsNode *in_RDI;
  CTcPrsOpComma *in_stack_00000008;
  
  pCVar1 = CTcPrsOpComma::eval_constant(in_stack_00000008,(CTcPrsNode *)this,in_RDI);
  return pCVar1;
}

Assistant:

CTcPrsNode *CTPNCommaBase::fold_binop()
{
    /* use the normal addition folder */
    return S_op_comma.eval_constant(left_, right_);
}